

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_ar.c
# Opt level: O2

size_t WebRtcSpl_FilterAR(int16_t *a,size_t a_length,int16_t *x,size_t x_length,int16_t *state,
                         size_t state_length,int16_t *state_low,size_t state_low_length,
                         int16_t *filtered,int16_t *filtered_low,size_t filtered_low_length)

{
  ulong uVar1;
  short sVar2;
  short *psVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int16_t *piVar10;
  int16_t *piVar11;
  int iVar12;
  
  uVar8 = 0;
  piVar10 = filtered;
  piVar11 = filtered_low;
  while (uVar8 != x_length) {
    iVar12 = (int)*x << 0xc;
    uVar1 = uVar8 + 1;
    sVar6 = a_length;
    if (uVar8 < a_length) {
      sVar6 = uVar1;
    }
    iVar9 = 0;
    lVar5 = -2;
    for (uVar8 = 1; uVar8 < sVar6; uVar8 = uVar8 + 1) {
      iVar12 = iVar12 - (int)*(short *)((long)piVar10 + lVar5) * (int)a[uVar8];
      iVar9 = iVar9 - (int)*(short *)((long)piVar11 + lVar5) * (int)a[uVar8];
      lVar5 = lVar5 + -2;
    }
    psVar3 = (short *)((long)a - lVar5);
    lVar5 = state_length - 1;
    for (uVar8 = uVar1; uVar8 < a_length; uVar8 = uVar8 + 1) {
      sVar2 = *psVar3;
      iVar12 = iVar12 - (int)state[lVar5] * (int)sVar2;
      psVar3 = psVar3 + 1;
      iVar9 = iVar9 - (int)state_low[lVar5] * (int)sVar2;
      lVar5 = lVar5 + -1;
    }
    x = x + 1;
    uVar4 = iVar12 + (iVar9 >> 0xc) + 0x800;
    *piVar10 = (int16_t)(uVar4 >> 0xc);
    piVar10 = piVar10 + 1;
    *piVar11 = ((short)iVar12 + (short)(iVar9 >> 0xc)) - ((ushort)uVar4 & 0xf000);
    piVar11 = piVar11 + 1;
    uVar8 = uVar1;
  }
  lVar5 = state_length - x_length;
  if (state_length < x_length || lVar5 == 0) {
    WebRtcSpl_CopyFromEndW16(filtered,x_length,a_length - 1,state);
    WebRtcSpl_CopyFromEndW16(filtered_low,x_length,a_length - 1,state_low);
  }
  else {
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      state[lVar7] = state[x_length + lVar7];
      state_low[lVar7] = state_low[x_length + lVar7];
    }
    for (sVar6 = 0; x_length != sVar6; sVar6 = sVar6 + 1) {
      state[lVar5 + sVar6] = filtered[sVar6];
      state[lVar5 + sVar6] = filtered_low[sVar6];
    }
  }
  return x_length;
}

Assistant:

size_t WebRtcSpl_FilterAR(const int16_t* a,
                          size_t a_length,
                          const int16_t* x,
                          size_t x_length,
                          int16_t* state,
                          size_t state_length,
                          int16_t* state_low,
                          size_t state_low_length,
                          int16_t* filtered,
                          int16_t* filtered_low,
                          size_t filtered_low_length)
{
    int32_t o;
    int32_t oLOW;
    size_t i, j, stop;
    const int16_t* x_ptr = &x[0];
    int16_t* filteredFINAL_ptr = filtered;
    int16_t* filteredFINAL_LOW_ptr = filtered_low;

    for (i = 0; i < x_length; i++)
    {
        // Calculate filtered[i] and filtered_low[i]
        const int16_t* a_ptr = &a[1];
        int16_t* filtered_ptr = &filtered[i - 1];
        int16_t* filtered_low_ptr = &filtered_low[i - 1];
        int16_t* state_ptr = &state[state_length - 1];
        int16_t* state_low_ptr = &state_low[state_length - 1];

        o = (int32_t)(*x_ptr++) << 12;
        oLOW = (int32_t)0;

        stop = (i < a_length) ? i + 1 : a_length;
        for (j = 1; j < stop; j++)
        {
          o -= *a_ptr * *filtered_ptr--;
          oLOW -= *a_ptr++ * *filtered_low_ptr--;
        }
        for (j = i + 1; j < a_length; j++)
        {
          o -= *a_ptr * *state_ptr--;
          oLOW -= *a_ptr++ * *state_low_ptr--;
        }

        o += (oLOW >> 12);
        *filteredFINAL_ptr = (int16_t)((o + (int32_t)2048) >> 12);
        *filteredFINAL_LOW_ptr++ = (int16_t)(o - ((int32_t)(*filteredFINAL_ptr++)
                << 12));
    }

    // Save the filter state
    if (x_length >= state_length)
    {
        WebRtcSpl_CopyFromEndW16(filtered, x_length, a_length - 1, state);
        WebRtcSpl_CopyFromEndW16(filtered_low, x_length, a_length - 1, state_low);
    } else
    {
        for (i = 0; i < state_length - x_length; i++)
        {
            state[i] = state[i + x_length];
            state_low[i] = state_low[i + x_length];
        }
        for (i = 0; i < x_length; i++)
        {
            state[state_length - x_length + i] = filtered[i];
            state[state_length - x_length + i] = filtered_low[i];
        }
    }

    return x_length;
}